

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void standard_palette_init(standard_display *dp)

{
  store_palette_entry *__src;
  int local_1c;
  int i;
  store_palette_entry *palette;
  standard_display *dp_local;
  
  __src = store_current_palette(dp->ps,&dp->npalette);
  if (0 < dp->npalette) {
    local_1c = dp->npalette;
    memcpy(dp->palette,__src,(long)local_1c << 2);
    do {
      local_1c = local_1c + -1;
      if (local_1c < 0) break;
    } while (__src[local_1c].alpha == 0xff);
    if (local_1c < 0) {
      dp->is_transparent = 0;
    }
    else {
      dp->is_transparent = 1;
    }
  }
  return;
}

Assistant:

static void
standard_palette_init(standard_display *dp)
{
   store_palette_entry *palette = store_current_palette(dp->ps, &dp->npalette);

   /* The remaining entries remain white/opaque. */
   if (dp->npalette > 0)
   {
      int i = dp->npalette;
      memcpy(dp->palette, palette, i * sizeof *palette);

      /* Check for a non-opaque palette entry: */
      while (--i >= 0)
         if (palette[i].alpha < 255)
            break;

#     ifdef __GNUC__
         /* GCC can't handle the more obviously optimizable version. */
         if (i >= 0)
            dp->is_transparent = 1;
         else
            dp->is_transparent = 0;
#     else
         dp->is_transparent = (i >= 0);
#     endif
   }
}